

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_timedlock.c
# Opt level: O0

int mtx_timedlock(mtx_t *mtx,timespec *ts)

{
  int iVar1;
  timespec *ts_local;
  mtx_t *mtx_local;
  
  iVar1 = pthread_mutex_timedlock((pthread_mutex_t *)mtx,(timespec *)ts);
  if (iVar1 == 0) {
    mtx_local._4_4_ = 1;
  }
  else if (iVar1 == 0x6e) {
    mtx_local._4_4_ = 0;
  }
  else {
    mtx_local._4_4_ = 3;
  }
  return mtx_local._4_4_;
}

Assistant:

int mtx_timedlock( mtx_t * _PDCLIB_restrict mtx, const struct timespec * _PDCLIB_restrict ts )
{
    switch ( pthread_mutex_timedlock( mtx, ts ) )
    {
        case 0:
            return thrd_success;

        case ETIMEDOUT:
            return thrd_timedout;

        default:
            return thrd_error;
    }
}